

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

RawSchema ** __thiscall
capnp::SchemaLoader::Validator::makeDependencyArray(Validator *this,uint32_t *count)

{
  Entry *pEVar1;
  ulong uVar2;
  ulong uVar3;
  Leaf *pLVar4;
  TreeMap<unsigned_long,_capnp::_::RawSchema_*> *__range2;
  ArrayPtr<const_capnp::_::RawSchema_*> AVar5;
  Iterator __begin2;
  Iterator __end2;
  Iterator local_60;
  Iterator local_48;
  
  uVar2 = (long)(this->dependencies).table.rows.builder.pos -
          (long)(this->dependencies).table.rows.builder.ptr >> 4;
  *count = (uint32_t)uVar2;
  AVar5 = kj::Arena::allocateArray<capnp::_::RawSchema_const*>
                    (&this->loader->arena,uVar2 & 0xffffffff);
  pEVar1 = (this->dependencies).table.rows.builder.ptr;
  local_60.tree = (this->dependencies).table.indexes.impl.tree;
  pLVar4 = (Leaf *)(local_60.tree + (this->dependencies).table.indexes.impl.beginLeaf);
  local_60.row = 0;
  local_60.leaf = pLVar4;
  kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::end(&local_48,&this->dependencies);
  uVar3 = 0;
  uVar2 = 0;
  while ((pLVar4 != local_48.inner.leaf || ((uint)uVar3 != local_48.inner.row))) {
    AVar5.ptr[uVar2] = pEVar1[pLVar4->rows[uVar3].i - 1].value;
    kj::_::BTreeImpl::Iterator::operator++(&local_60);
    uVar2 = (ulong)((int)uVar2 + 1);
    pLVar4 = local_60.leaf;
    uVar3 = (ulong)local_60.row;
  }
  return AVar5.ptr;
}

Assistant:

const _::RawSchema** makeDependencyArray(uint32_t* count) {
    *count = dependencies.size();
    kj::ArrayPtr<const _::RawSchema*> result =
        loader.arena.allocateArray<const _::RawSchema*>(*count);
    uint pos = 0;
    for (auto& dep: dependencies) {
      result[pos++] = dep.value;
    }
    KJ_DASSERT(pos == *count);
    return result.begin();
  }